

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherwiseStatement.h
# Opt level: O0

void __thiscall OtherwiseStatement::execute(OtherwiseStatement *this,Environment *env)

{
  element_type *peVar1;
  Environment local;
  ThrowPacket *anon_var_0;
  Environment *env_local;
  OtherwiseStatement *this_local;
  
  peVar1 = std::__shared_ptr_access<Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->statement);
  (**peVar1->_vptr_Statement)(peVar1,env);
  return;
}

Assistant:

void execute(Environment *env) override {
        try {
            statement -> execute(env);
        } catch(ThrowPacket&) {
            Environment local = *env;
            statementBlock -> execute(&local);
        }
    }